

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

mat3x2f * __thiscall Triangle::jacobi(mat3x2f *__return_storage_ptr__,Triangle *this)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  int k;
  long lVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  float local_8;
  float local_4;
  
  fVar10 = (this->v1).x;
  fVar9 = (this->v1).y;
  fVar7 = (this->v1).z;
  pfVar1 = &local_18;
  local_18 = (this->v2).x - fVar10;
  local_10 = (this->v2).y - fVar9;
  local_8 = (this->v2).z - fVar7;
  local_14 = (this->v3).x - fVar10;
  local_c = (this->v3).y - fVar9;
  local_4 = (this->v3).z - fVar7;
  fVar10 = (this->vt1).x;
  fVar9 = (this->vt1).y;
  fVar7 = (this->vt2).x - fVar10;
  fVar8 = (this->vt2).y - fVar9;
  fVar10 = (this->vt3).x - fVar10;
  fVar9 = (this->vt3).y - fVar9;
  fVar11 = 1.0 / (fVar7 * fVar9 - fVar8 * fVar10);
  local_28 = fVar9 * fVar11;
  fStack_24 = -fVar10 * fVar11;
  fStack_20 = -fVar8 * fVar11;
  fStack_1c = fVar7 * fVar11;
  __return_storage_ptr__->data[0] = (float  [2])0x0;
  __return_storage_ptr__->data[1] = (float  [2])0x0;
  __return_storage_ptr__->data[2] = (float  [2])0x0;
  lVar2 = 0;
  do {
    pfVar3 = &local_28;
    lVar4 = 0;
    do {
      fVar10 = __return_storage_ptr__->data[lVar2][lVar4];
      lVar5 = 0;
      do {
        fVar10 = fVar10 + pfVar1[lVar5] * pfVar3[lVar5 * 2];
        lVar5 = lVar5 + 1;
      } while (lVar5 == 1);
      __return_storage_ptr__->data[lVar2][lVar4] = fVar10;
      pfVar3 = pfVar3 + 1;
      bVar6 = lVar4 == 0;
      lVar4 = lVar4 + 1;
    } while (bVar6);
    lVar2 = lVar2 + 1;
    pfVar1 = pfVar1 + 2;
  } while (lVar2 != 3);
  return __return_storage_ptr__;
}

Assistant:

mat3x2f jacobi() const // [dpdu dpdv]
	{
		return mat3x2f(v2-v1, v3-v1) * inverse(mat2f(vt2-vt1, vt3-vt1));
	}